

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_PartialEquivalencyTestExtraField_Test::
~MessageDifferencerTest_PartialEquivalencyTestExtraField_Test
          (MessageDifferencerTest_PartialEquivalencyTestExtraField_Test *this)

{
  MessageDifferencerTest_PartialEquivalencyTestExtraField_Test *this_local;
  
  ~MessageDifferencerTest_PartialEquivalencyTestExtraField_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, PartialEquivalencyTestExtraField) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);
  TestUtil::SetAllFields(&msg2);

  msg1.clear_optional_int32();

  // Compare
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}